

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_iterator.cpp
# Opt level: O0

iterator * __thiscall csv::CSVReader::begin(iterator *__return_storage_ptr__,CSVReader *this)

{
  bool bVar1;
  pointer pTVar2;
  CSVRow local_68;
  undefined1 local_39;
  CSVReader *local_38;
  code *local_30;
  undefined8 local_28;
  thread local_20;
  CSVReader *local_18;
  CSVReader *this_local;
  iterator *ret;
  
  local_18 = this;
  this_local = (CSVReader *)__return_storage_ptr__;
  pTVar2 = std::
           unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           ::operator->(&this->records);
  bVar1 = internals::ThreadSafeDeque<csv::CSVRow>::empty(pTVar2);
  if (bVar1) {
    local_30 = read_csv;
    local_28 = 0;
    local_38 = this;
    std::thread::
    thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
              (&local_20,(type *)&local_30,&local_38,&internals::ITERATION_CHUNK_SIZE);
    std::thread::operator=(&this->read_csv_worker,&local_20);
    std::thread::~thread(&local_20);
    std::thread::join();
    pTVar2 = std::
             unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             ::operator->(&this->records);
    bVar1 = internals::ThreadSafeDeque<csv::CSVRow>::empty(pTVar2);
    if (bVar1) {
      end(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
  }
  this->_n_rows = this->_n_rows + 1;
  local_39 = 0;
  pTVar2 = std::
           unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           ::operator->(&this->records);
  internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_68,pTVar2);
  iterator::iterator(__return_storage_ptr__,this,&local_68);
  CSVRow::~CSVRow(&local_68);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVReader::iterator CSVReader::begin() {
        if (this->records->empty()) {
            this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
            this->read_csv_worker.join();

            // Still empty => return end iterator
            if (this->records->empty()) return this->end();
        }

        this->_n_rows++;
        CSVReader::iterator ret(this, this->records->pop_front());
        return ret;
    }